

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

SSL_ECH_KEYS * SSL_ECH_KEYS_new(void)

{
  SSL_ECH_KEYS *pSVar1;
  
  pSVar1 = (SSL_ECH_KEYS *)OPENSSL_malloc(0x20);
  if (pSVar1 == (SSL_ECH_KEYS *)0x0) {
    pSVar1 = (SSL_ECH_KEYS *)0x0;
  }
  else {
    (pSVar1->super_RefCounted<ssl_ech_keys_st>).references_ = 1;
    (pSVar1->configs).data_ = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x0;
    (pSVar1->configs).size_ = 0;
    (pSVar1->configs).capacity_ = 0;
  }
  return pSVar1;
}

Assistant:

SSL_ECH_KEYS *SSL_ECH_KEYS_new() { return New<SSL_ECH_KEYS>(); }